

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall TaprootUtil_Bip86_1_Test::TestBody(TaprootUtil_Bip86_1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_360;
  Message local_358;
  string local_350;
  undefined1 local_330 [8];
  AssertionResult gtest_ar_5;
  Message local_318;
  string local_310;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_4;
  Message local_2d8;
  string local_2d0;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_288 [8];
  TapBranch branch_elements;
  Message local_200;
  string local_1f8;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_2;
  Message local_1c0;
  string local_1b8;
  undefined1 local_198 [8];
  AssertionResult gtest_ar_1;
  Message local_180;
  string local_178;
  undefined1 local_158 [8];
  AssertionResult gtest_ar;
  ByteData ctrl;
  Script locking_script;
  SchnorrPubkey output_key;
  TapBranch branch;
  allocator local_49;
  string local_48;
  undefined1 local_28 [8];
  SchnorrPubkey pk;
  TaprootUtil_Bip86_1_Test *this_local;
  
  pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             &local_49);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  cfd::core::TapBranch::TapBranch
            ((TapBranch *)
             &output_key.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&gtest_ar.message_,(SchnorrPubkey *)local_28,
             (TapBranch *)
             &output_key.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_178,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_158,
             "\"a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb\"",
             "output_key.GetHex()",(char (*) [65])0x71f04f,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1df,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_1b8,
             (Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_198,
             "\"5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb\"",
             "locking_script.GetHex()",
             (char (*) [69])"5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
             &local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1e1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_1f8,(ByteData *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[67],std::__cxx11::string>
            ((EqHelper<false> *)local_1d8,
             "\"c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145\"",
             "ctrl.GetHex()",
             (char (*) [67])"c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             &local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_200);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&branch_elements.is_elements_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1e3,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&branch_elements.is_elements_,&local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&branch_elements.is_elements_);
    testing::Message::~Message(&local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  cfd::core::TapBranch::TapBranch((TapBranch *)local_288,kElementsRegtest);
  cfd::core::TaprootUtil::CreateTapScriptControl
            ((ByteData *)&gtest_ar_3.message_,(SchnorrPubkey *)local_28,(TapBranch *)local_288,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::operator=((ByteData *)&gtest_ar.message_,(ByteData *)&gtest_ar_3.message_);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar_3.message_);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_2d0,
             (SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_2b0,
             "\"c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0\"",
             "output_key.GetHex()",(char (*) [65])0x73ebc2,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(&local_2d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1ea,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_310,
             (Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_2f0,
             "\"5120c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0\"",
             "locking_script.GetHex()",
             (char (*) [69])"5120c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0",
             &local_310);
  std::__cxx11::string::~string((string *)&local_310);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1ec,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_318);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_350,(ByteData *)&gtest_ar.message_);
  testing::internal::EqHelper<false>::Compare<char[67],std::__cxx11::string>
            ((EqHelper<false> *)local_330,
             "\"c583dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145\"",
             "ctrl.GetHex()",
             (char (*) [67])"c583dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
             &local_350);
  std::__cxx11::string::~string((string *)&local_350);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_330);
  if (!bVar1) {
    testing::Message::Message(&local_358);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_330);
    testing::internal::AssertHelper::AssertHelper
              (&local_360,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1ee,pcVar2);
    testing::internal::AssertHelper::operator=(&local_360,&local_358);
    testing::internal::AssertHelper::~AssertHelper(&local_360);
    testing::Message::~Message(&local_358);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_330);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_288);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  cfd::core::Script::~Script
            ((Script *)
             &ctrl.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::TapBranch::~TapBranch
            ((TapBranch *)
             &output_key.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_28);
  return;
}

Assistant:

TEST(TaprootUtil, Bip86_1) {
  // https://github.com/bitcoin/bips/blob/master/bip-0086.mediawiki
  // Account 0, second receiving address = m/86'/0'/0'/0/1
  // xprv         = xprvA449goEeU9okyiF1LmKiDaTgeXvmh87DVyRd35VPbsSop8n8uALpbtrUhUXByPFKK7C2yuqrB1FrhiDkEMC4RGmA5KTwsE1aB5jRu9zHsuQ
  // xpub         = xpub6H3W6JmYJXN4CCKUSnriaiQRCZmG6aq4sCMDqTu1ACyngw7HShf59hAxYjXgKDuuHThVEUzdHrc3aXCr9kfvQvZPit5dnD3K9xVRBzjK3rX
  // internal_key = 83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145
  // output_key   = a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // scriptPubKey = 5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb
  // address      = bc1p4qhjn9zdvkux4e44uhx8tc55attvtyu358kutcqkudyccelu0was9fqzwh
  SchnorrPubkey pk("83dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145");
  TapBranch branch;

  SchnorrPubkey output_key;
  Script locking_script;
  auto ctrl = TaprootUtil::CreateTapScriptControl(
    pk, branch, &output_key, &locking_script);
  EXPECT_EQ("a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
      output_key.GetHex());
  EXPECT_EQ("5120a82f29944d65b86ae6b5e5cc75e294ead6c59391a1edc5e016e3498c67fc7bbb",
      locking_script.GetHex());
  EXPECT_EQ("c083dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
      ctrl.GetHex());
  
  // for elements
  TapBranch branch_elements(NetType::kElementsRegtest);
  ctrl = TaprootUtil::CreateTapScriptControl(
    pk, branch_elements, &output_key, &locking_script);
  EXPECT_EQ("c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0",
      output_key.GetHex());
  EXPECT_EQ("5120c73ac1b7a518499b9642aed8cfa15d5401e5bd85ad760b937b69521c297722f0",
      locking_script.GetHex());
  EXPECT_EQ("c583dfe85a3151d2517290da461fe2815591ef69f2b18a2ce63f01697a8b313145",
      ctrl.GetHex());
}